

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O1

void RtMidi::getCompiledApi(vector<RtMidi::Api,_std::allocator<RtMidi::Api>_> *apis)

{
  allocator_type local_29;
  void *local_28 [2];
  long local_18;
  
  std::vector<RtMidi::Api,std::allocator<RtMidi::Api>>::vector<RtMidi::Api_const*,void>
            ((vector<RtMidi::Api,std::allocator<RtMidi::Api>> *)local_28,rtmidi_compiled_apis,
             rtmidi_compiled_apis + 1,&local_29);
  std::vector<RtMidi::Api,_std::allocator<RtMidi::Api>_>::_M_move_assign(apis,local_28);
  if (local_28[0] != (void *)0x0) {
    operator_delete(local_28[0],local_18 - (long)local_28[0]);
  }
  return;
}

Assistant:

void RtMidi :: getCompiledApi( std::vector<RtMidi::Api> &apis ) throw()
{
  apis = std::vector<RtMidi::Api>(rtmidi_compiled_apis,
                                  rtmidi_compiled_apis + rtmidi_num_compiled_apis);
}